

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

char * cmExpandVariablesInString(void *arg,char *source,int escapeQuotes,int atOnly)

{
  string *psVar1;
  char *pcVar2;
  allocator<char> local_41;
  string barf;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&barf,source,&local_41);
  psVar1 = cmMakefile::ExpandVariablesInString
                     ((cmMakefile *)arg,&barf,escapeQuotes != 0,atOnly != 0,false,(char *)0x0,-1,
                      false,false);
  pcVar2 = strdup((psVar1->_M_dataplus)._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)barf._M_dataplus._M_p != &barf.field_2) {
    operator_delete(barf._M_dataplus._M_p,barf.field_2._M_allocated_capacity + 1);
  }
  return pcVar2;
}

Assistant:

char CCONV* cmExpandVariablesInString(void* arg, const char* source,
                                      int escapeQuotes, int atOnly)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  std::string barf = source;
  std::string const& result =
    mf->ExpandVariablesInString(barf, escapeQuotes != 0, atOnly != 0);
  return strdup(result.c_str());
}